

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O0

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined1 local_908 [8];
  secp256k1_gej tmpj;
  secp256k1_fe neg_y_3;
  int idx_n_3;
  int abs_n_3;
  int mask_3;
  int m_3;
  secp256k1_fe neg_y_2;
  int idx_n_2;
  int abs_n_2;
  int mask_2;
  int m_2;
  int j;
  int n;
  secp256k1_fe neg_y_1;
  int idx_n_1;
  int abs_n_1;
  int mask_1;
  int m_1;
  secp256k1_fe neg_y;
  int idx_n;
  int abs_n;
  int mask;
  int m;
  int rsize;
  int i;
  int wnaf_1 [33];
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  uint local_6c8;
  int skew_lam;
  int wnaf_lam [33];
  undefined1 local_638 [8];
  secp256k1_ge pre_a_lam [8];
  int local_36c;
  undefined1 local_368 [4];
  int skew_1;
  secp256k1_fe Z;
  secp256k1_ge tmpa;
  secp256k1_ge pre_a [8];
  int size_local;
  secp256k1_scalar *scalar_local;
  secp256k1_ge *a_local;
  secp256k1_gej *r_local;
  
  pre_a[7]._84_4_ = size;
  if (size < 0x81) {
    local_36c = secp256k1_wnaf_const(&rsize,scalar,4,size);
    q_1.d[3]._4_4_ = 0;
    mask = size;
  }
  else {
    mask = 0x80;
    secp256k1_scalar_split_lambda
              ((secp256k1_scalar *)(q_lam.d + 3),(secp256k1_scalar *)(wnaf_1 + 0x20),scalar);
    local_36c = secp256k1_wnaf_const(&rsize,(secp256k1_scalar *)(q_lam.d + 3),4,0x80);
    q_1.d[3]._4_4_ =
         secp256k1_wnaf_const((int *)&local_6c8,(secp256k1_scalar *)(wnaf_1 + 0x20),4,0x80);
  }
  secp256k1_gej_set_ge(r,a);
  secp256k1_ecmult_odd_multiples_table_globalz_windowa
            ((secp256k1_ge *)&tmpa.infinity,(secp256k1_fe *)local_368,r);
  for (m = 0; m < 8; m = m + 1) {
    secp256k1_fe_normalize_weak((secp256k1_fe *)(pre_a[m].x.n + 4));
  }
  if (0x80 < (int)pre_a[7]._84_4_) {
    for (m = 0; m < 8; m = m + 1) {
      secp256k1_ge_mul_lambda
                ((secp256k1_ge *)&pre_a_lam[(long)m + -1].infinity,
                 (secp256k1_ge *)&pre_a[(long)m + -1].infinity);
    }
  }
  uVar1 = (&rsize)[(mask + 3) / 4];
  neg_y.n[4]._4_4_ = uVar1 + ((int)uVar1 >> 0x1f) ^ (int)uVar1 >> 0x1f;
  neg_y.n[4]._0_4_ = (int)neg_y.n[4]._4_4_ >> 1;
  memcpy(Z.n + 4,&tmpa.infinity,0x28);
  memcpy(tmpa.x.n + 4,pre_a[0].x.n + 4,0x28);
  for (abs_n = 1; abs_n < 8; abs_n = abs_n + 1) {
    secp256k1_fe_cmov((secp256k1_fe *)(Z.n + 4),(secp256k1_fe *)&pre_a[(long)abs_n + -1].infinity,
                      (uint)(abs_n == (int)neg_y.n[4]));
    secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(pre_a[abs_n].x.n + 4),
                      (uint)(abs_n == (int)neg_y.n[4]));
  }
  tmpa.y.n[4]._0_4_ = 0;
  secp256k1_fe_negate((secp256k1_fe *)&mask_1,(secp256k1_fe *)(tmpa.x.n + 4),1);
  secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)&mask_1,
                    (uint)(uVar1 != neg_y.n[4]._4_4_));
  secp256k1_gej_set_ge(r,(secp256k1_ge *)(Z.n + 4));
  if (0x80 < (int)pre_a[7]._84_4_) {
    uVar1 = (&local_6c8)[(mask + 3) / 4];
    neg_y_1.n[4]._4_4_ = uVar1 + ((int)uVar1 >> 0x1f) ^ (int)uVar1 >> 0x1f;
    neg_y_1.n[4]._0_4_ = (int)neg_y_1.n[4]._4_4_ >> 1;
    memcpy(Z.n + 4,local_638,0x28);
    memcpy(tmpa.x.n + 4,pre_a_lam[0].x.n + 4,0x28);
    for (abs_n_1 = 1; abs_n_1 < 8; abs_n_1 = abs_n_1 + 1) {
      secp256k1_fe_cmov((secp256k1_fe *)(Z.n + 4),
                        (secp256k1_fe *)&pre_a_lam[(long)abs_n_1 + -1].infinity,
                        (uint)(abs_n_1 == (int)neg_y_1.n[4]));
      secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(pre_a_lam[abs_n_1].x.n + 4),
                        (uint)(abs_n_1 == (int)neg_y_1.n[4]));
    }
    tmpa.y.n[4]._0_4_ = 0;
    secp256k1_fe_negate((secp256k1_fe *)&j,(secp256k1_fe *)(tmpa.x.n + 4),1);
    secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)&j,
                      (uint)(uVar1 != neg_y_1.n[4]._4_4_));
    secp256k1_gej_add_ge(r,r,(secp256k1_ge *)(Z.n + 4));
  }
  m = (mask + 3) / 4;
  while (m = m + -1, -1 < m) {
    for (mask_2 = 0; mask_2 < 4; mask_2 = mask_2 + 1) {
      secp256k1_gej_double(r,r);
    }
    uVar1 = (&rsize)[m];
    neg_y_2.n[4]._4_4_ = uVar1 + ((int)uVar1 >> 0x1f) ^ (int)uVar1 >> 0x1f;
    neg_y_2.n[4]._0_4_ = (int)neg_y_2.n[4]._4_4_ >> 1;
    memcpy(Z.n + 4,&tmpa.infinity,0x28);
    memcpy(tmpa.x.n + 4,pre_a[0].x.n + 4,0x28);
    for (abs_n_2 = 1; abs_n_2 < 8; abs_n_2 = abs_n_2 + 1) {
      secp256k1_fe_cmov((secp256k1_fe *)(Z.n + 4),
                        (secp256k1_fe *)&pre_a[(long)abs_n_2 + -1].infinity,
                        (uint)(abs_n_2 == (int)neg_y_2.n[4]));
      secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)(pre_a[abs_n_2].x.n + 4),
                        (uint)(abs_n_2 == (int)neg_y_2.n[4]));
    }
    tmpa.y.n[4]._0_4_ = 0;
    secp256k1_fe_negate((secp256k1_fe *)&mask_3,(secp256k1_fe *)(tmpa.x.n + 4),1);
    secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)&mask_3,
                      (uint)(uVar1 != neg_y_2.n[4]._4_4_));
    secp256k1_gej_add_ge(r,r,(secp256k1_ge *)(Z.n + 4));
    if (0x80 < (int)pre_a[7]._84_4_) {
      uVar1 = (&local_6c8)[m];
      uVar2 = uVar1 + ((int)uVar1 >> 0x1f) ^ (int)uVar1 >> 0x1f;
      iVar3 = (int)uVar2 >> 1;
      memcpy(Z.n + 4,local_638,0x28);
      memcpy(tmpa.x.n + 4,pre_a_lam[0].x.n + 4,0x28);
      for (abs_n_3 = 1; abs_n_3 < 8; abs_n_3 = abs_n_3 + 1) {
        secp256k1_fe_cmov((secp256k1_fe *)(Z.n + 4),
                          (secp256k1_fe *)&pre_a_lam[(long)abs_n_3 + -1].infinity,
                          (uint)(abs_n_3 == iVar3));
        secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),
                          (secp256k1_fe *)(pre_a_lam[abs_n_3].x.n + 4),(uint)(abs_n_3 == iVar3));
      }
      tmpa.y.n[4]._0_4_ = 0;
      secp256k1_fe_negate((secp256k1_fe *)&tmpj.infinity,(secp256k1_fe *)(tmpa.x.n + 4),1);
      secp256k1_fe_cmov((secp256k1_fe *)(tmpa.x.n + 4),(secp256k1_fe *)&tmpj.infinity,
                        (uint)(uVar1 != uVar2));
      secp256k1_gej_add_ge(r,r,(secp256k1_ge *)(Z.n + 4));
    }
  }
  secp256k1_ge_neg((secp256k1_ge *)(Z.n + 4),(secp256k1_ge *)&tmpa.infinity);
  secp256k1_gej_add_ge((secp256k1_gej *)local_908,r,(secp256k1_ge *)(Z.n + 4));
  secp256k1_gej_cmov(r,(secp256k1_gej *)local_908,local_36c);
  if (0x80 < (int)pre_a[7]._84_4_) {
    secp256k1_ge_neg((secp256k1_ge *)(Z.n + 4),(secp256k1_ge *)local_638);
    secp256k1_gej_add_ge((secp256k1_gej *)local_908,r,(secp256k1_ge *)(Z.n + 4));
    secp256k1_gej_cmov(r,(secp256k1_gej *)local_908,q_1.d[3]._4_4_);
  }
  secp256k1_fe_mul(&r->z,&r->z,(secp256k1_fe *)local_368);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    /* build wnaf representation for q. */
    int rsize = size;
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);
    } else
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, scalar, WINDOW_A - 1, size);
        skew_lam = 0;
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }

    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        if (size > 128) {
            secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
            secp256k1_gej_add_ge(&tmpj, r, &tmpa);
            secp256k1_gej_cmov(r, &tmpj, skew_lam);
        }
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}